

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O3

bool __thiscall ObjectIdentifier::ToString(ObjectIdentifier *this,string *out)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  char cVar4;
  char *__s;
  long *plVar5;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  long lVar13;
  ulong __val;
  char cVar14;
  bool bVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint __len;
  int iVar19;
  size_type *local_98;
  string tmp;
  string __str;
  long *local_50;
  long local_40;
  long lStack_38;
  
  __str.field_2._8_8_ = this;
  __s = GetOidString(this->oidIndex);
  if (__s != (char *)0x0) {
    pcVar2 = (char *)out->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)out,0,pcVar2,(ulong)__s);
  }
  local_98 = &tmp._M_string_length;
  tmp._M_dataplus._M_p = (pointer)0x0;
  tmp._M_string_length._0_1_ = 0;
  pbVar3 = *(byte **)(__str.field_2._8_8_ + 0x10);
  if (*(byte **)(__str.field_2._8_8_ + 0x18) == pbVar3) {
LAB_0013888d:
    bVar15 = false;
    goto LAB_00138ab8;
  }
  if (*pbVar3 < 0x28) {
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,0x13efd8);
    bVar1 = **(byte **)(__str.field_2._8_8_ + 0x10);
    uVar18 = 1;
    if (9 < bVar1) {
      uVar18 = 3 - (bVar1 < 100);
    }
    tmp.field_2._8_8_ = &__str._M_string_length;
    std::__cxx11::string::_M_construct((ulong)((long)&tmp.field_2 + 8),(char)uVar18);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)tmp.field_2._8_8_,uVar18,(uint)bVar1);
    plVar5 = (long *)std::__cxx11::string::replace
                               ((ulong)((long)&tmp.field_2 + 8),0,(char *)0x0,0x13ef79);
    local_50 = &local_40;
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_40 = *plVar8;
      lStack_38 = plVar5[3];
    }
    else {
      local_40 = *plVar8;
      local_50 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_50);
LAB_001388c7:
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if ((size_type *)tmp.field_2._8_8_ != &__str._M_string_length) {
      operator_delete((void *)tmp.field_2._8_8_);
    }
    uVar17 = 1;
  }
  else {
    if (*pbVar3 < 0x50) {
      std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,0x140635);
      uVar16 = **(byte **)(__str.field_2._8_8_ + 0x10) - 0x28;
      uVar18 = -uVar16;
      if (0 < (int)uVar16) {
        uVar18 = uVar16;
      }
      __len = 1;
      if (9 < uVar18) {
        __len = 3 - (uVar18 < 100);
      }
      tmp.field_2._8_8_ = &__str._M_string_length;
      std::__cxx11::string::_M_construct
                ((ulong)((long)&tmp.field_2 + 8),(char)__len - (char)((int)uVar16 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar16 >> 0x1f) + tmp.field_2._8_8_),__len,uVar18);
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)((long)&tmp.field_2 + 8),0,(char *)0x0,0x13ef79)
      ;
      local_50 = &local_40;
      plVar5 = puVar7 + 2;
      if ((long *)*puVar7 == plVar5) {
        local_40 = *plVar5;
        lStack_38 = puVar7[3];
      }
      else {
        local_40 = *plVar5;
        local_50 = (long *)*puVar7;
      }
      *puVar7 = plVar5;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_50);
      goto LAB_001388c7;
    }
    pbVar11 = *(byte **)(__str.field_2._8_8_ + 0x18) + ~(ulong)pbVar3;
    pbVar9 = (byte *)0x5;
    if (pbVar11 < (byte *)0x5) {
      pbVar9 = pbVar11;
    }
    pbVar11 = (byte *)0x0;
    uVar17 = 0;
    do {
      uVar17 = pbVar3[(long)pbVar11] & 0x7f | uVar17;
      pbVar12 = pbVar11;
      if (-1 < (char)pbVar3[(long)pbVar11]) break;
      uVar17 = uVar17 << 7;
      pbVar11 = pbVar11 + 1;
      pbVar12 = (byte *)(ulong)((int)pbVar9 + 1);
    } while (pbVar9 + 1 != pbVar11);
    bVar15 = false;
    if (((int)pbVar12 == 6) || (uVar17 >> 0x20 != 0)) goto LAB_00138ab8;
    if (uVar17 < 0x50) goto LAB_0013888d;
    std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)0x0,0x140689);
    uVar17 = uVar17 - 0x50;
    cVar14 = '\x01';
    if (9 < uVar17) {
      uVar10 = uVar17;
      cVar4 = '\x04';
      do {
        cVar14 = cVar4;
        if (uVar10 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_00138ae6;
        }
        if (uVar10 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_00138ae6;
        }
        if (uVar10 < 10000) goto LAB_00138ae6;
        bVar15 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar4 = cVar14 + '\x04';
      } while (bVar15);
      cVar14 = cVar14 + '\x01';
    }
LAB_00138ae6:
    tmp.field_2._8_8_ = &__str._M_string_length;
    std::__cxx11::string::_M_construct((ulong)((long)&tmp.field_2 + 8),cVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)tmp.field_2._8_8_,(uint)__str._M_dataplus._M_p,uVar17);
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)((long)&tmp.field_2 + 8),0,(char *)0x0,0x13ef79);
    plVar5 = puVar7 + 2;
    if ((long *)*puVar7 == plVar5) {
      local_40 = *plVar5;
      lStack_38 = puVar7[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar5;
      local_50 = (long *)*puVar7;
    }
    *puVar7 = plVar5;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    uVar17 = (ulong)((int)pbVar12 + 1);
    if ((size_type *)tmp.field_2._8_8_ != &__str._M_string_length) {
      operator_delete((void *)tmp.field_2._8_8_);
    }
  }
  lVar6 = *(long *)(__str.field_2._8_8_ + 0x10);
  uVar10 = *(long *)(__str.field_2._8_8_ + 0x18) - lVar6;
  if (uVar17 < uVar10) {
    do {
      uVar10 = uVar10 - 1;
      if (4 < uVar10) {
        uVar10 = 5;
      }
      iVar19 = (int)uVar10 + 1;
      lVar13 = 0;
      __val = 0;
      do {
        bVar1 = *(byte *)(lVar6 + uVar17 + lVar13);
        __val = bVar1 & 0x7f | __val;
        if (-1 < (char)bVar1) {
          iVar19 = (int)lVar13;
          break;
        }
        __val = __val << 7;
        lVar13 = lVar13 + 1;
      } while (uVar10 + 1 != lVar13);
      bVar15 = false;
      if ((iVar19 == 6) || (bVar15 = false, __val >> 0x20 != 0)) goto LAB_00138ab8;
      cVar14 = '\x01';
      tmp.field_2._8_8_ = &__str._M_string_length;
      if (9 < __val) {
        uVar10 = __val;
        cVar4 = '\x04';
        do {
          cVar14 = cVar4;
          if (uVar10 < 100) {
            cVar14 = cVar14 + -2;
            goto LAB_001389cd;
          }
          if (uVar10 < 1000) {
            cVar14 = cVar14 + -1;
            goto LAB_001389cd;
          }
          if (uVar10 < 10000) goto LAB_001389cd;
          bVar15 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar4 = cVar14 + '\x04';
        } while (bVar15);
        cVar14 = cVar14 + '\x01';
      }
LAB_001389cd:
      std::__cxx11::string::_M_construct((ulong)(&tmp.field_2._M_allocated_capacity + 1),cVar14);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)tmp.field_2._8_8_,(uint)__str._M_dataplus._M_p,__val);
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)(&tmp.field_2._M_allocated_capacity + 1),0,(char *)0x0,0x13ef79);
      plVar5 = puVar7 + 2;
      if ((long *)*puVar7 == plVar5) {
        local_40 = *plVar5;
        lStack_38 = puVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar5;
        local_50 = (long *)*puVar7;
      }
      *puVar7 = plVar5;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_50);
      if (local_50 != &local_40) {
        operator_delete(local_50);
      }
      if ((size_type *)tmp.field_2._8_8_ != &__str._M_string_length) {
        operator_delete((void *)tmp.field_2._8_8_);
      }
      uVar17 = uVar17 + (iVar19 + 1);
      lVar6 = *(long *)(__str.field_2._8_8_ + 0x10);
      uVar10 = *(long *)(__str.field_2._8_8_ + 0x18) - lVar6;
    } while (uVar17 < uVar10);
  }
  std::__cxx11::string::swap((string *)out);
  bVar15 = true;
LAB_00138ab8:
  if (local_98 != &tmp._M_string_length) {
    operator_delete(local_98);
  }
  return bVar15;
}

Assistant:

bool ObjectIdentifier::ToString(std::string & out) const
{
    // If possible, just look it up in our table
    const char* szOid = this->GetOidString();

    if (szOid != nullptr)
	{
		out = szOid;
	}
        
	std::string tmp;
	size_t cbRead = 0;
	size_t pos = 0;
	unsigned long node = 0;

	if (value.size() < 1)
	{
		return false;
	}
		
	if (value[0] < 40)
	{
		tmp = "0";
		tmp += "." + std::to_string(value[0]);
		cbRead = 1;
	}
	else if (value[0] < 80)
	{
		tmp = "1";
		tmp += "." + std::to_string(value[0] - 40);
		cbRead = 1;
	}
	else
	{
		if (!DecodeLong(&value[0], value.size(), node, cbRead) || node < 80)
			return false;

		tmp = "2";
		tmp += "." + std::to_string(node - 80);
	}

	pos = cbRead;

	for (; pos < value.size(); pos += cbRead)
	{
		if (!DecodeLong(&value[pos], value.size(), node, cbRead))
			return false;

		tmp += "." + std::to_string(node);
	}

	out.swap(tmp);
	return true;
}